

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandReporter.cpp
# Opt level: O0

string * __thiscall
ApprovalTests::CommandReporter::assembleFullCommand
          (CommandReporter *this,string *received,string *approved)

{
  element_type *peVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> convertedApproved;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> convertedReceived;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> convertedCommand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char __rhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  string *inText;
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [48];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  undefined8 local_20;
  undefined8 local_18;
  
  __lhs_00 = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  peVar1 = ::std::
           __shared_ptr_access<ApprovalTests::ConvertForCygwin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ApprovalTests::ConvertForCygwin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x194a0a);
  __rhs_00 = (char)((ulong)in_RDI >> 0x38);
  inText = local_80;
  (*peVar1->_vptr_ConvertForCygwin[2])(inText,peVar1,in_RSI + 8);
  ::std::operator+((char)((ulong)in_stack_fffffffffffffd88 >> 0x38),in_stack_fffffffffffffd80);
  ::std::operator+(in_stack_fffffffffffffd88,(char)((ulong)in_stack_fffffffffffffd80 >> 0x38));
  ::std::__cxx11::string::~string(local_60);
  ::std::__cxx11::string::~string((string *)local_80);
  peVar1 = ::std::
           __shared_ptr_access<ApprovalTests::ConvertForCygwin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ApprovalTests::ConvertForCygwin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x194a89);
  (*peVar1->_vptr_ConvertForCygwin[3])(local_f0,peVar1,local_18);
  ::std::operator+((char)((ulong)in_stack_fffffffffffffd88 >> 0x38),in_stack_fffffffffffffd80);
  ::std::operator+(in_stack_fffffffffffffd88,(char)((ulong)in_stack_fffffffffffffd80 >> 0x38));
  ::std::__cxx11::string::~string(local_d0);
  ::std::__cxx11::string::~string(local_f0);
  peVar1 = ::std::
           __shared_ptr_access<ApprovalTests::ConvertForCygwin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ApprovalTests::ConvertForCygwin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x194b07);
  (*peVar1->_vptr_ConvertForCygwin[3])(local_150,peVar1,local_20);
  ::std::operator+((char)((ulong)in_stack_fffffffffffffd88 >> 0x38),in_stack_fffffffffffffd80);
  ::std::operator+(in_stack_fffffffffffffd88,(char)((ulong)in_stack_fffffffffffffd80 >> 0x38));
  ::std::__cxx11::string::~string(local_130);
  ::std::__cxx11::string::~string(local_150);
  ::std::__cxx11::string::string((string *)&local_170);
  ::std::__cxx11::string::string(local_1b0,(string *)(in_RSI + 0x28));
  DiffInfo::receivedFileTemplate_abi_cxx11_();
  StringUtils::replaceAll(inText,in_RSI,(string *)__lhs_00);
  __lhs = &local_170;
  __rhs = &local_190;
  ::std::__cxx11::string::operator=((string *)__lhs,(string *)__rhs);
  ::std::__cxx11::string::~string((string *)__rhs);
  ::std::__cxx11::string::~string(local_1d0);
  ::std::__cxx11::string::~string(local_1b0);
  ::std::__cxx11::string::string(local_210,(string *)__lhs);
  DiffInfo::approvedFileTemplate_abi_cxx11_();
  StringUtils::replaceAll(inText,in_RSI,(string *)__lhs_00);
  ::std::__cxx11::string::operator=((string *)&local_170,local_1f0);
  ::std::__cxx11::string::~string(local_1f0);
  ::std::__cxx11::string::~string(local_230);
  ::std::__cxx11::string::~string(local_210);
  ::std::operator+(__lhs_00,__rhs_00);
  ::std::operator+(__lhs,__rhs);
  ::std::__cxx11::string::~string(local_250);
  ::std::__cxx11::string::~string((string *)&local_170);
  ::std::__cxx11::string::~string(local_110);
  ::std::__cxx11::string::~string(local_b0);
  ::std::__cxx11::string::~string(local_40);
  return __lhs_00;
}

Assistant:

std::string CommandReporter::assembleFullCommand(const std::string& received,
                                                     const std::string& approved) const
    {
        auto convertedCommand = '"' + converter->convertProgramForCygwin(cmd) + '"';
        auto convertedReceived =
            '"' + converter->convertFileArgumentForCygwin(received) + '"';
        auto convertedApproved =
            '"' + converter->convertFileArgumentForCygwin(approved) + '"';

        std::string args;
        args = StringUtils::replaceAll(
            arguments, DiffInfo::receivedFileTemplate(), convertedReceived);
        args = StringUtils::replaceAll(
            args, DiffInfo::approvedFileTemplate(), convertedApproved);

        return convertedCommand + ' ' + args;
    }